

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# configuration_object.c
# Opt level: O0

int configuration_object_childs_cb_iterate(set s,set_key key,set_value val,set_cb_iterate_args args)

{
  int iVar1;
  long lVar2;
  char *in_RCX;
  configuration in_RDX;
  set_key in_RSI;
  configuration child;
  char *path;
  value v;
  configuration_childs_cb_iterator iterator;
  configuration local_48;
  undefined8 local_40;
  char *name;
  
  iVar1 = configuration_object_childs_cb_iterate_valid(in_RSI,in_RDX);
  if ((iVar1 == 0) &&
     (name = in_RCX, lVar2 = set_get(*(undefined8 *)(in_RCX + 0x18),in_RSI), lVar2 == 0)) {
    local_40 = value_to_string(in_RDX);
    local_48 = configuration_object_initialize(name,in_RCX,in_RDX);
    if (local_48 == (configuration)0x0) {
      in_RCX[0] = '\x01';
      in_RCX[1] = '\0';
      in_RCX[2] = '\0';
      in_RCX[3] = '\0';
      return 1;
    }
    vector_push_back(*(undefined8 *)(in_RCX + 0x10),&local_48);
  }
  return 0;
}

Assistant:

int configuration_object_childs_cb_iterate(set s, set_key key, set_value val, set_cb_iterate_args args)
{
	(void)s;

	if (configuration_object_childs_cb_iterate_valid(key, val) == 0)
	{
		configuration_childs_cb_iterator iterator = args;

		if (set_get(iterator->storage, key) == NULL)
		{
			value v = val;

			const char *path = value_to_string(v);

			configuration child = configuration_object_initialize(key, path, iterator->parent);

			if (child == NULL)
			{
				iterator->result = 1;

				return 1;
			}

			vector_push_back(iterator->childs, &child);
		}
	}

	return 0;
}